

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
Hospital::Find_Doctor_From_His_Field_vector
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Hospital *this,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,string *field)

{
  iterator __position;
  _Alloc_hider _Var1;
  int iVar2;
  pointer pDVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  int local_54;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_54 = 0;
  pDVar3 = (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
      super__Vector_impl_data._M_finish != pDVar3) {
    uVar4 = 0;
    do {
      Doctor::Field_getter_abi_cxx11_(&local_50,pDVar3 + uVar4);
      _Var1._M_p = local_50._M_dataplus._M_p;
      if (local_50._M_string_length == field->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar2 = bcmp(local_50._M_dataplus._M_p,(field->_M_dataplus)._M_p,local_50._M_string_length
                      );
          bVar6 = iVar2 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_50.field_2) {
        operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,&local_54)
          ;
        }
        else {
          *__position._M_current = local_54;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar4 = (long)local_54 + 1;
      local_54 = (int)uVar4;
      pDVar3 = (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pDVar3 >> 3) * 0x51b3bea3677d46cf;
    } while (uVar4 <= uVar5 && uVar5 - uVar4 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int>  Hospital::  Find_Doctor_From_His_Field_vector (vector<Doctor> All_Of_Doctors,string field){
    vector<int> finded ;
    for (int i = 0; i <All_Of_Doctors.size() ; ++i) {
        if (All_Of_Doctors[i].Field_getter() == field){
            finded.push_back(i);
        }
    }
    return finded;
}